

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous_namespace)::Counts,(wasm::
Mutability)0,wasm::InsertOrderedMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm
::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts&)>)::Mapper::doWalkFunction(wasm::
Function__(void *this,Function *curr)

{
  Function *__args;
  size_t sVar1;
  Counts *__args_1;
  Function *local_18;
  Function *curr_local;
  Mapper *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  sVar1 = InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
          count(*(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                  **)((long)this + 0x110),&local_18);
  __args = local_18;
  if (sVar1 != 0) {
    __args_1 = InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
               ::operator[](*(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                              **)((long)this + 0x110),&local_18);
    std::function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>::
    operator()((function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>
                *)((long)this + 0x118),__args,__args_1);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x192,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous namespace)::Counts, wasm::Immutable, wasm::InsertOrderedMap>::ParallelFunctionAnalysis(Module &, Func)::Mapper::doWalkFunction(Function *) [T = wasm::ModuleUtils::(anonymous namespace)::Counts, Mut = wasm::Immutable, MapT = wasm::InsertOrderedMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }